

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O1

void __thiscall UnitTest_table3::UnitTest_table3(UnitTest_table3 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_001886f8;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_UnitTestBase).test_name_,0,
             (char *)(this->super_UnitTestBase).test_name_._M_string_length,0x1697e0);
  return;
}

Assistant:

TEST_CASE(table3)
{
    luna::Table t;
    luna::Value key;
    luna::Value value;

    key.type_ = luna::ValueT_Bool;
    key.bvalue_ = true;

    value.type_ = luna::ValueT_Bool;
    value.bvalue_ = false;

    t.SetValue(key, value);
    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Bool);
    EXPECT_TRUE(value.bvalue_ == false);

    t.SetValue(value, key);
    key = t.GetValue(value);
    EXPECT_TRUE(key.type_ == luna::ValueT_Bool);
    EXPECT_TRUE(key.bvalue_ == true);

    luna::Value nil;
    value = t.GetValue(nil);
    EXPECT_TRUE(value.type_ == luna::ValueT_Nil);
}